

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp.cpp
# Opt level: O2

CompressionFunction * duckdb::GetChimpFunction<float>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_CHIMP;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = ChimpInitAnalyze<float>;
  in_RDI->analyze = ChimpAnalyze<float>;
  in_RDI->final_analyze = ChimpFinalAnalyze<float>;
  in_RDI->init_compression = ChimpInitCompression<float>;
  in_RDI->compress = ChimpCompress<float>;
  in_RDI->compress_finalize = ChimpFinalizeCompress<float>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = ChimpInitScan<float>;
  in_RDI->scan_vector = ChimpScan<float>;
  in_RDI->scan_partial = ChimpScanPartial<float>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = ChimpFetchRow<float>;
  in_RDI->skip = ChimpSkip<float>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction GetChimpFunction(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_CHIMP, data_type, ChimpInitAnalyze<T>, ChimpAnalyze<T>,
	                           ChimpFinalAnalyze<T>, ChimpInitCompression<T>, ChimpCompress<T>,
	                           ChimpFinalizeCompress<T>, ChimpInitScan<T>, ChimpScan<T>, ChimpScanPartial<T>,
	                           ChimpFetchRow<T>, ChimpSkip<T>);
}